

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCov.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_debc::CCov::addCoverageTraceCall
          (CCov *this,Instruction *Inst,FunctionCallee CoverageFunction)

{
  value_type pVVar1;
  FunctionCallee Callee;
  uint uVar2;
  uint32_t C;
  Module *this_00;
  string *psVar3;
  Constant *pCVar4;
  reference ppVVar5;
  ConstantInt *pCVar6;
  Twine local_210;
  ArrayRef<llvm::Value_*> local_1e8;
  FunctionType *local_1d8;
  Value *pVStack_1d0;
  Twine local_1c0;
  StringRef local_198;
  StringRef local_188;
  undefined1 local_178 [8];
  string FunctionNameStr;
  StringRef local_130 [2];
  undefined1 local_110 [8];
  string FileNameStr;
  undefined1 local_e8 [4];
  uint32_t Attribute;
  array<llvm::Value_*,_4UL> Args;
  DebugLoc *Loc;
  undefined1 local_b0 [8];
  IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> Builder;
  Instruction *Inst_local;
  CCov *this_local;
  FunctionCallee CoverageFunction_local;
  
  Builder._128_8_ = Inst;
  llvm::ArrayRef<llvm::OperandBundleDefT<llvm::Value_*>_>::ArrayRef
            ((ArrayRef<llvm::OperandBundleDefT<llvm::Value_*>_> *)&Loc,None);
  llvm::IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter>::IRBuilder
            ((IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> *)local_b0,Inst,
             (MDNode *)0x0,_Loc);
  Args._M_elems[3] = (Value *)llvm::Instruction::getDebugLoc((Instruction *)Builder._128_8_);
  FileNameStr.field_2._12_4_ = 0;
  if (this->FileName == (Constant *)0x0) {
    this_00 = llvm::Instruction::getModule((Instruction *)Builder._128_8_);
    psVar3 = llvm::Module::getSourceFileName_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)local_110,(string *)psVar3);
    llvm::StringRef::StringRef(local_130,(string *)local_110);
    llvm::Twine::Twine((Twine *)((long)&FunctionNameStr.field_2 + 8),"");
    pCVar4 = llvm::IRBuilderBase::CreateGlobalStringPtr
                       ((IRBuilderBase *)local_b0,local_130[0],
                        (Twine *)((long)&FunctionNameStr.field_2 + 8),0,(Module *)0x0);
    this->FileName = pCVar4;
    std::__cxx11::string::~string((string *)local_110);
  }
  if (this->FunctionName == (Constant *)0x0) {
    llvm::Instruction::getFunction((Instruction *)Builder._128_8_);
    local_188 = (StringRef)llvm::Value::getName();
    llvm::StringRef::str_abi_cxx11_((string *)local_178,&local_188);
    llvm::StringRef::StringRef(&local_198,(string *)local_178);
    llvm::Twine::Twine(&local_1c0,"");
    pCVar4 = llvm::IRBuilderBase::CreateGlobalStringPtr
                       ((IRBuilderBase *)local_b0,local_198,&local_1c0,0,(Module *)0x0);
    this->FunctionName = pCVar4;
    FileNameStr.field_2._12_4_ = FileNameStr.field_2._12_4_ | 1;
    std::__cxx11::string::~string((string *)local_178);
  }
  uVar2 = llvm::Instruction::getOpcode((Instruction *)Builder._128_8_);
  if (uVar2 == 1) {
    FileNameStr.field_2._12_4_ = FileNameStr.field_2._12_4_ | 2;
  }
  pVVar1 = (value_type)this->FileName;
  ppVVar5 = std::array<llvm::Value_*,_4UL>::operator[]((array<llvm::Value_*,_4UL> *)local_e8,0);
  *ppVVar5 = pVVar1;
  pVVar1 = (value_type)this->FunctionName;
  ppVVar5 = std::array<llvm::Value_*,_4UL>::operator[]((array<llvm::Value_*,_4UL> *)local_e8,1);
  *ppVVar5 = pVVar1;
  C = llvm::DebugLoc::getLine();
  pCVar6 = llvm::IRBuilderBase::getInt32((IRBuilderBase *)local_b0,C);
  ppVVar5 = std::array<llvm::Value_*,_4UL>::operator[]((array<llvm::Value_*,_4UL> *)local_e8,2);
  *ppVVar5 = (value_type)pCVar6;
  pCVar6 = llvm::IRBuilderBase::getInt32((IRBuilderBase *)local_b0,FileNameStr.field_2._12_4_);
  ppVVar5 = std::array<llvm::Value_*,_4UL>::operator[]((array<llvm::Value_*,_4UL> *)local_e8,3);
  *ppVVar5 = (value_type)pCVar6;
  local_1d8 = CoverageFunction.FnTy;
  pVStack_1d0 = CoverageFunction.Callee;
  llvm::ArrayRef<llvm::Value*>::ArrayRef<4ul>
            ((ArrayRef<llvm::Value*> *)&local_1e8,(array<llvm::Value_*,_4UL> *)local_e8);
  llvm::Twine::Twine(&local_210,"");
  Callee.Callee = pVStack_1d0;
  Callee.FnTy = local_1d8;
  llvm::IRBuilderBase::CreateCall
            ((IRBuilderBase *)local_b0,Callee,local_1e8,&local_210,(MDNode *)0x0);
  llvm::IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter>::~IRBuilder
            ((IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> *)local_b0);
  return;
}

Assistant:

void CCov::addCoverageTraceCall(Instruction *Inst,
    FunctionCallee CoverageFunction) {
  IRBuilder<> Builder(Inst);
  const DebugLoc &Loc = Inst->getDebugLoc();
  std::array<Value *, 4> Args;
  uint32_t Attribute = 0;
  if (!FileName) {
    std::string FileNameStr = Inst->getModule()->getSourceFileName();
    FileName = Builder.CreateGlobalStringPtr(FileNameStr);
  }
  if (!FunctionName) {
    std::string FunctionNameStr = Inst->getFunction()->getName().str();
    FunctionName = Builder.CreateGlobalStringPtr(FunctionNameStr);
    Attribute |= CCov_Entry;
  }
  if (Inst->getOpcode() == Instruction::Ret)
    Attribute |= CCov_Ret;
  Args[0] = FileName;
  Args[1] = FunctionName;
  Args[2] = Builder.getInt32((uint32_t)Loc.getLine());
  Args[3] = Builder.getInt32(Attribute);
  Builder.CreateCall(CoverageFunction, ArrayRef<Value *>(Args));
}